

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cVertexAttribBindingTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::BasicInputCase5::Run(BasicInputCase5 *this)

{
  long lVar1;
  Vector<float,_4> local_280;
  Vector<float,_4> local_270;
  Vector<float,_4> local_260;
  Vector<float,_4> local_250;
  Vector<float,_4> local_240;
  Vector<float,_4> local_230;
  Vector<float,_4> local_220;
  Vector<float,_4> local_210;
  Vector<float,_4> local_200;
  Vector<float,_4> local_1f0;
  Vector<float,_4> local_1e0;
  Vector<float,_4> local_1d0;
  Vector<float,_4> local_1c0;
  Vector<float,_4> local_1b0;
  Vector<float,_4> local_1a0;
  Vector<float,_4> local_190;
  Vector<float,_4> local_180;
  Vector<float,_4> local_170;
  Vector<float,_4> local_160;
  Vector<float,_4> local_150;
  Vector<float,_4> local_140;
  Vector<float,_4> local_130;
  Vector<float,_4> local_120;
  Vector<float,_4> local_110;
  Vector<float,_4> local_100;
  Vector<float,_4> local_f0;
  uint local_e0;
  undefined4 local_dc;
  GLuint i_1;
  GLint d_21;
  GLuint d_20;
  GLubyte d_19 [4];
  GLhalf d_18 [4];
  GLfloat d_17 [4];
  GLint d_16 [4];
  GLshort d_15 [4];
  GLbyte d_14 [4];
  GLuint d_13 [4];
  GLushort d_12 [4];
  GLubyte d_11 [4];
  GLint d_10;
  GLuint d_9;
  GLubyte d_8 [4];
  GLhalf d_7 [4];
  GLfloat d_6 [4];
  GLint d_5 [4];
  GLshort d_4 [4];
  GLbyte d_3 [4];
  GLuint d_2 [4];
  GLushort d_1 [4];
  GLubyte d [4];
  int kStride;
  GLuint i;
  BasicInputCase5 *this_local;
  
  d[0] = '\0';
  d[1] = '\0';
  d[2] = '\0';
  d[3] = '\0';
  for (; (uint)d < 0x10; d = (GLubyte  [4])((int)d + 1)) {
    glu::CallLogWrapper::glVertexAttrib4f
              (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
                super_GLWrapper.super_CallLogWrapper,(GLuint)d,0.0,0.0,0.0,0.0);
  }
  d_1[2] = 0x74;
  d_1[3] = 0;
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,this->m_vbo);
  glu::CallLogWrapper::glBufferData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0xe8,(void *)0x0,0x88e4);
  d_1[0] = 0xff00;
  d_1[1] = 0x7f;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0,4,d_1);
  stack0xffffffffffffffdc = 0x7fffffff0000;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,4,8,d_2 + 3);
  stack0xffffffffffffffc8 = 0xffffffff00000000;
  d_2[0] = 0x7fffffff;
  d_2[1] = 0;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0xc,0x10,d_4 + 2);
  d_4[0] = -0x7f00;
  d_4[1] = 0x7f;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x1c,4,d_4);
  stack0xffffffffffffffbc = 0x7fff80010000;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x20,8,d_5 + 3);
  d_6[2] = 0.0;
  d_6[3] = -1.4013e-45;
  d_5[0] = 0x7fffffff;
  d_5[1] = 0;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x28,0x10,d_6 + 2);
  d_7[0] = 0;
  d_7[1] = 0;
  d_7[2] = 0;
  d_7[3] = 0x3f80;
  d_6[0] = 2.0;
  d_6[1] = 0.0;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x38,0x10,d_7);
  d_9._0_2_ = VertexAttribBindingBase::FloatToHalf((VertexAttribBindingBase *)this,0.0);
  d_9._2_2_ = VertexAttribBindingBase::FloatToHalf((VertexAttribBindingBase *)this,10.0);
  d_8._0_2_ = VertexAttribBindingBase::FloatToHalf((VertexAttribBindingBase *)this,20.0);
  d_8._2_2_ = VertexAttribBindingBase::FloatToHalf((VertexAttribBindingBase *)this,0.0);
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x48,8,&d_9);
  d_10 = -0x80c100;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x68,4,&d_10);
  d_11[0] = '\0';
  d_11[1] = 0xfc;
  d_11[2] = 0xff;
  d_11[3] = '_';
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x6c,4,d_11);
  d_12[2] = 0xfc00;
  d_12[3] = 0xff7;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x70,4,d_12 + 2);
  d_12[0] = 0xffff;
  d_12[1] = 0x7f;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x74,4,d_12);
  d_13[2] = 0xffffffff;
  d_13[3] = 0x7fff;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x78,8,d_13 + 2);
  stack0xffffffffffffff68 = 0xffffffffffffffff;
  d_13[0] = 0x7fffffff;
  d_13[1] = 0;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x80,0x10,d_15 + 2);
  d_15[0] = -0x7e81;
  d_15[1] = 0x7f;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x90,4,d_15);
  stack0xffffffffffffff5c = 0x7fff80017fff;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x94,8,d_16 + 3);
  d_17[2] = NAN;
  d_17[3] = -1.4013e-45;
  d_16[0] = 0x7fffffff;
  d_16[1] = 0;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x9c,0x10,d_17 + 2);
  d_18[0] = 0;
  d_18[1] = 0;
  d_18[2] = 0;
  d_18[3] = 0x4040;
  d_17[0] = 4.0;
  d_17[1] = 0.0;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0xac,0x10,d_18);
  d_20._0_2_ = VertexAttribBindingBase::FloatToHalf((VertexAttribBindingBase *)this,0.0);
  d_20._2_2_ = VertexAttribBindingBase::FloatToHalf((VertexAttribBindingBase *)this,30.0);
  d_19._0_2_ = VertexAttribBindingBase::FloatToHalf((VertexAttribBindingBase *)this,40.0);
  d_19._2_2_ = VertexAttribBindingBase::FloatToHalf((VertexAttribBindingBase *)this,0.0);
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0xbc,8,&d_20);
  d_21 = 0x3f7fff;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0xdc,4,&d_21);
  i_1 = 0x9ffffc00;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0xe0,4,&i_1);
  local_dc = 0xcff7fe01;
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0xe4,4,&local_dc);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0);
  glu::CallLogWrapper::glBindVertexArray
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,this->m_vao);
  glu::CallLogWrapper::glVertexAttribFormat
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0,4,0x1401,'\x01',0);
  glu::CallLogWrapper::glVertexAttribFormat
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,1,4,0x1403,'\x01',4);
  glu::CallLogWrapper::glVertexAttribFormat
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,2,4,0x1405,'\x01',0xc);
  glu::CallLogWrapper::glVertexAttribFormat
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,3,4,0x1400,'\x01',0x1c);
  glu::CallLogWrapper::glVertexAttribFormat
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,4,4,0x1402,'\x01',0x20);
  glu::CallLogWrapper::glVertexAttribFormat
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,5,4,0x1404,'\x01',0x28);
  glu::CallLogWrapper::glVertexAttribFormat
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,6,4,0x1406,'\x01',0x38);
  glu::CallLogWrapper::glVertexAttribFormat
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,7,4,0x140b,'\x01',0x48);
  glu::CallLogWrapper::glVertexAttribFormat
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,8,4,0x1401,'\x01',0x68);
  glu::CallLogWrapper::glVertexAttribFormat
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,9,4,0x8368,'\x01',0x6c);
  glu::CallLogWrapper::glVertexAttribFormat
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,10,4,0x8368,'\x01',0x6c);
  glu::CallLogWrapper::glVertexAttribFormat
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0xb,4,0x8d9f,'\x01',0x70);
  glu::CallLogWrapper::glVertexAttribFormat
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0xc,4,0x8d9f,'\x01',0x70);
  for (local_e0 = 0; local_e0 < 0xd; local_e0 = local_e0 + 1) {
    glu::CallLogWrapper::glVertexAttribBinding
              (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
                super_GLWrapper.super_CallLogWrapper,local_e0,0);
    glu::CallLogWrapper::glEnableVertexAttribArray
              (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
                super_GLWrapper.super_CallLogWrapper,local_e0);
  }
  glu::CallLogWrapper::glBindVertexBuffer
            (&(this->super_BasicInputBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0,this->m_vbo,0,0x74);
  tcu::Vector<float,_4>::Vector(&local_f0,0.0,1.0,0.5,0.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0].m_data = local_f0.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0].m_data + 2) = local_f0.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_100,0.0,1.0,0.5,0.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[1].m_data = local_100.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[1].m_data + 2) = local_100.m_data._8_8_
  ;
  tcu::Vector<float,_4>::Vector(&local_110,0.0,1.0,0.5,0.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[2].m_data = local_110.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[2].m_data + 2) = local_110.m_data._8_8_
  ;
  tcu::Vector<float,_4>::Vector(&local_120,0.0,-1.0,1.0,0.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[3].m_data = local_120.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[3].m_data + 2) = local_120.m_data._8_8_
  ;
  tcu::Vector<float,_4>::Vector(&local_130,0.0,-1.0,1.0,0.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[4].m_data = local_130.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[4].m_data + 2) = local_130.m_data._8_8_
  ;
  tcu::Vector<float,_4>::Vector(&local_140,0.0,-1.0,1.0,0.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[5].m_data = local_140.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[5].m_data + 2) = local_140.m_data._8_8_
  ;
  tcu::Vector<float,_4>::Vector(&local_150,0.0,1.0,2.0,0.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[6].m_data = local_150.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[6].m_data + 2) = local_150.m_data._8_8_
  ;
  tcu::Vector<float,_4>::Vector(&local_160,0.0,10.0,20.0,0.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[7].m_data = local_160.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[7].m_data + 2) = local_160.m_data._8_8_
  ;
  tcu::Vector<float,_4>::Vector(&local_170,0.0,0.25,0.5,1.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[8].m_data = local_170.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[8].m_data + 2) = local_170.m_data._8_8_
  ;
  tcu::Vector<float,_4>::Vector(&local_180,0.0,1.0,0.5,0.33);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[9].m_data = local_180.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[9].m_data + 2) = local_180.m_data._8_8_
  ;
  tcu::Vector<float,_4>::Vector(&local_190,0.0,1.0,0.5,0.33);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[10].m_data = local_190.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[10].m_data + 2) =
       local_190.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_1a0,0.0,1.0,0.5,0.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0xb].m_data = local_1a0.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0xb].m_data + 2) =
       local_1a0.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_1b0,0.0,1.0,0.5,0.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0xc].m_data = local_1b0.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0xc].m_data + 2) =
       local_1b0.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_1c0,1.0,1.0,0.5,0.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0xf].m_data = local_1c0.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0xf].m_data + 2) =
       local_1c0.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_1d0,1.0,1.0,0.5,0.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0x10].m_data = local_1d0.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0x10].m_data + 2) =
       local_1d0.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_1e0,1.0,1.0,0.5,0.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0x11].m_data = local_1e0.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0x11].m_data + 2) =
       local_1e0.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_1f0,1.0,-1.0,1.0,0.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0x12].m_data = local_1f0.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0x12].m_data + 2) =
       local_1f0.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_200,1.0,-1.0,1.0,0.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0x13].m_data = local_200.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0x13].m_data + 2) =
       local_200.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_210,1.0,-1.0,1.0,0.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0x14].m_data = local_210.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0x14].m_data + 2) =
       local_210.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_220,0.0,3.0,4.0,0.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0x15].m_data = local_220.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0x15].m_data + 2) =
       local_220.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_230,0.0,30.0,40.0,0.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0x16].m_data = local_230.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0x16].m_data + 2) =
       local_230.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_240,1.0,0.5,0.25,0.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0x17].m_data = local_240.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0x17].m_data + 2) =
       local_240.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_250,0.0,1.0,0.5,0.66);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0x18].m_data = local_250.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0x18].m_data + 2) =
       local_250.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_260,0.0,1.0,0.5,0.66);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0x19].m_data = local_260.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0x19].m_data + 2) =
       local_260.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_270,-1.0,1.0,0.5,-1.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0x1a].m_data = local_270.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0x1a].m_data + 2) =
       local_270.m_data._8_8_;
  tcu::Vector<float,_4>::Vector(&local_280,-1.0,1.0,0.5,-1.0);
  *(undefined8 *)(this->super_BasicInputBase).expected_data[0x1b].m_data = local_280.m_data._0_8_;
  *(undefined8 *)((this->super_BasicInputBase).expected_data[0x1b].m_data + 2) =
       local_280.m_data._8_8_;
  lVar1 = BasicInputBase::Run(&this->super_BasicInputBase);
  return lVar1;
}

Assistant:

virtual long Run()
	{
		for (GLuint i = 0; i < 16; ++i)
		{
			glVertexAttrib4f(i, 0.0f, 0.0f, 0.0f, 0.0f);
		}
		const int kStride = 116;
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo);
		glBufferData(GL_ARRAY_BUFFER, kStride * 2, NULL, GL_STATIC_DRAW);
		/* */
		{
			GLubyte d[] = { 0, 0xff, 0xff / 2, 0 };
			glBufferSubData(GL_ARRAY_BUFFER, 0, sizeof(d), d);
		}
		/* */
		{
			GLushort d[] = { 0, 0xffff, 0xffff / 2, 0 };
			glBufferSubData(GL_ARRAY_BUFFER, 4, sizeof(d), d);
		}
		/* */
		{
			GLuint d[] = { 0, 0xffffffff, 0xffffffff / 2, 0 };
			glBufferSubData(GL_ARRAY_BUFFER, 12, sizeof(d), d);
		}
		/* */
		{
			GLbyte d[] = { 0, -127, 127, 0 };
			glBufferSubData(GL_ARRAY_BUFFER, 28, sizeof(d), d);
		}
		/* */
		{
			GLshort d[] = { 0, -32767, 32767, 0 };
			glBufferSubData(GL_ARRAY_BUFFER, 32, sizeof(d), d);
		}
		/* */
		{
			GLint d[] = { 0, -2147483647, 2147483647, 0 };
			glBufferSubData(GL_ARRAY_BUFFER, 40, sizeof(d), d);
		}
		/* */
		{
			GLfloat d[] = { 0, 1.0f, 2.0f, 0 };
			glBufferSubData(GL_ARRAY_BUFFER, 56, sizeof(d), d);
		}
		/* */
		{
			GLhalf d[] = { FloatToHalf(0.0), FloatToHalf(10.0), FloatToHalf(20.0), FloatToHalf(0.0) };
			glBufferSubData(GL_ARRAY_BUFFER, 72, sizeof(d), d);
		}
		/* */
		{
			GLubyte d[] = { 0, 0xff / 4, 0xff / 2, 0xff };
			glBufferSubData(GL_ARRAY_BUFFER, 104, sizeof(d), d);
		}
		/* */
		{
			GLuint d = 0 | (1023 << 10) | (511 << 20) | (1 << 30);
			glBufferSubData(GL_ARRAY_BUFFER, 108, sizeof(d), &d);
		}
		/* */
		{
			GLint d = 0 | (511 << 10) | (255 << 20) | (0 << 30);
			glBufferSubData(GL_ARRAY_BUFFER, 112, sizeof(d), &d);
		}

		/* */
		{
			GLubyte d[] = { 0xff, 0xff, 0xff / 2, 0 };
			glBufferSubData(GL_ARRAY_BUFFER, 0 + kStride, sizeof(d), d);
		}
		/* */
		{
			GLushort d[] = { 0xffff, 0xffff, 0xffff / 2, 0 };
			glBufferSubData(GL_ARRAY_BUFFER, 4 + kStride, sizeof(d), d);
		}
		/* */
		{
			GLuint d[] = { 0xffffffff, 0xffffffff, 0xffffffff / 2, 0 };
			glBufferSubData(GL_ARRAY_BUFFER, 12 + kStride, sizeof(d), d);
		}
		/* */
		{
			GLbyte d[] = { 127, -127, 127, 0 };
			glBufferSubData(GL_ARRAY_BUFFER, 28 + kStride, sizeof(d), d);
		}
		/* */
		{
			GLshort d[] = { 32767, -32767, 32767, 0 };
			glBufferSubData(GL_ARRAY_BUFFER, 32 + kStride, sizeof(d), d);
		}
		/* */
		{
			GLint d[] = { 2147483647, -2147483647, 2147483647, 0 };
			glBufferSubData(GL_ARRAY_BUFFER, 40 + kStride, sizeof(d), d);
		}
		/* */
		{
			GLfloat d[] = { 0, 3.0f, 4.0f, 0 };
			glBufferSubData(GL_ARRAY_BUFFER, 56 + kStride, sizeof(d), d);
		}
		/* */
		{
			GLhalf d[] = { FloatToHalf(0.0), FloatToHalf(30.0), FloatToHalf(40.0), FloatToHalf(0.0) };
			glBufferSubData(GL_ARRAY_BUFFER, 72 + kStride, sizeof(d), d);
		}
		/* */
		{
			GLubyte d[] = { 0xff, 0xff / 2, 0xff / 4, 0 };
			glBufferSubData(GL_ARRAY_BUFFER, 104 + kStride, sizeof(d), d);
		}
		/* */
		{
			GLuint d = 0 | (1023 << 10) | (511 << 20) | (2u << 30);
			glBufferSubData(GL_ARRAY_BUFFER, 108 + kStride, sizeof(d), &d);
		}
		/* */
		{
			GLint d = (-511 & 0x3ff) | (511 << 10) | (255 << 20) | 3 << 30;
			glBufferSubData(GL_ARRAY_BUFFER, 112 + kStride, sizeof(d), &d);
		}
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		glBindVertexArray(m_vao);
		glVertexAttribFormat(0, 4, GL_UNSIGNED_BYTE, GL_TRUE, 0);
		glVertexAttribFormat(1, 4, GL_UNSIGNED_SHORT, GL_TRUE, 4);
		glVertexAttribFormat(2, 4, GL_UNSIGNED_INT, GL_TRUE, 12);
		glVertexAttribFormat(3, 4, GL_BYTE, GL_TRUE, 28);
		glVertexAttribFormat(4, 4, GL_SHORT, GL_TRUE, 32);
		glVertexAttribFormat(5, 4, GL_INT, GL_TRUE, 40);
		glVertexAttribFormat(6, 4, GL_FLOAT, GL_TRUE, 56);
		glVertexAttribFormat(7, 4, GL_HALF_FLOAT, GL_TRUE, 72);
		glVertexAttribFormat(8, 4, GL_UNSIGNED_BYTE, GL_TRUE, 104);
		glVertexAttribFormat(9, 4, GL_UNSIGNED_INT_2_10_10_10_REV, GL_TRUE, 108);
		glVertexAttribFormat(10, 4, GL_UNSIGNED_INT_2_10_10_10_REV, GL_TRUE, 108);
		glVertexAttribFormat(11, 4, GL_INT_2_10_10_10_REV, GL_TRUE, 112);
		glVertexAttribFormat(12, 4, GL_INT_2_10_10_10_REV, GL_TRUE, 112);
		for (GLuint i = 0; i < 13; ++i)
		{
			glVertexAttribBinding(i, 0);
			glEnableVertexAttribArray(i);
		}
		glBindVertexBuffer(0, m_vbo, 0, kStride);

		expected_data[0]	   = Vec4(0.0f, 1.0f, 0.5f, 0.0f);
		expected_data[1]	   = Vec4(0.0f, 1.0f, 0.5f, 0.0f);
		expected_data[2]	   = Vec4(0.0f, 1.0f, 0.5f, 0.0f);
		expected_data[3]	   = Vec4(0.0f, -1.0f, 1.0f, 0.0f);
		expected_data[4]	   = Vec4(0.0f, -1.0f, 1.0f, 0.0f);
		expected_data[5]	   = Vec4(0.0f, -1.0f, 1.0f, 0.0f);
		expected_data[6]	   = Vec4(0.0f, 1.0f, 2.0f, 0.0f);
		expected_data[7]	   = Vec4(0.0f, 10.0f, 20.0f, 0.0f);
		expected_data[8]	   = Vec4(0.0f, 0.25f, 0.5f, 1.0f);
		expected_data[9]	   = Vec4(0.0f, 1.0f, 0.5f, 0.33f);
		expected_data[10]	  = Vec4(0.0f, 1.0f, 0.5f, 0.33f);
		expected_data[11]	  = Vec4(0.0f, 1.0f, 0.5f, 0.0f);
		expected_data[12]	  = Vec4(0.0f, 1.0f, 0.5f, 0.0f);
		expected_data[0 + 15]  = Vec4(1.0f, 1.0f, 0.5f, 0.0f);
		expected_data[1 + 15]  = Vec4(1.0f, 1.0f, 0.5f, 0.0f);
		expected_data[2 + 15]  = Vec4(1.0f, 1.0f, 0.5f, 0.0f);
		expected_data[3 + 15]  = Vec4(1.0f, -1.0f, 1.0f, 0.0f);
		expected_data[4 + 15]  = Vec4(1.0f, -1.0f, 1.0f, 0.0f);
		expected_data[5 + 15]  = Vec4(1.0f, -1.0f, 1.0f, 0.0f);
		expected_data[6 + 15]  = Vec4(0.0f, 3.0f, 4.0f, 0.0f);
		expected_data[7 + 15]  = Vec4(0.0f, 30.0f, 40.0f, 0.0f);
		expected_data[8 + 15]  = Vec4(1.0f, 0.5f, 0.25f, 0.0f);
		expected_data[9 + 15]  = Vec4(0.0f, 1.0f, 0.5f, 0.66f);
		expected_data[10 + 15] = Vec4(0.0f, 1.0f, 0.5f, 0.66f);
		expected_data[11 + 15] = Vec4(-1.0f, 1.0f, 0.5f, -1.0f);
		expected_data[12 + 15] = Vec4(-1.0f, 1.0f, 0.5f, -1.0f);
		return BasicInputBase::Run();
	}